

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_query.cpp
# Opt level: O0

void __thiscall
HtmlFormParser_two_key_two_value_Test::~HtmlFormParser_two_key_two_value_Test
          (HtmlFormParser_two_key_two_value_Test *this)

{
  HtmlFormParser_two_key_two_value_Test *this_local;
  
  ~HtmlFormParser_two_key_two_value_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(HtmlFormParser, two_key_two_value) {
	std::vector<std::pair<std::u8string_view, std::u8string_view>> parsed_result;
	std::u8string query_text = u8"key=value&second_key=second=value";
	EXPECT_TRUE(jessilib::deserialize_html_form(parsed_result, query_text));
	EXPECT_TRUE(query_text.starts_with(u8"keyvaluesecond_keysecond=value"));
	EXPECT_EQ(parsed_result.size(), 2);
	EXPECT_EQ(parsed_result[0].first, u8"key");
	EXPECT_EQ(parsed_result[0].second, u8"value");
	EXPECT_EQ(parsed_result[1].first, u8"second_key");
	EXPECT_EQ(parsed_result[1].second, u8"second=value");
}